

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O0

uint64_t websocket_server_wrap
                   (void *target,void *msg,uint64_t len,uchar opcode,uchar first,uchar last,
                   uchar rsv)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 local_4c;
  uchar last_local;
  uchar first_local;
  uchar opcode_local;
  uint64_t len_local;
  void *msg_local;
  void *target_local;
  
  local_4c = opcode;
  if (first == '\0') {
    local_4c = 0;
  }
  *(byte *)target = local_4c & 0xf | (rsv & 7) << 4 | last << 7;
  uVar1 = (undefined1)len;
  if (len < 0x7e) {
    *(undefined1 *)((long)target + 1) = uVar1;
    memcpy((void *)((long)target + 2),msg,len);
    target_local = (void *)(len + 2);
  }
  else {
    uVar2 = (undefined1)(len >> 8);
    if (len < 0x10000) {
      *(undefined1 *)((long)target + 1) = 0x7e;
      *(undefined1 *)((long)target + 2) = uVar2;
      *(undefined1 *)((long)target + 3) = uVar1;
      memcpy((void *)((long)target + 4),msg,len);
      target_local = (void *)(len + 4);
    }
    else {
      *(undefined1 *)((long)target + 1) = 0x7f;
      *(char *)((long)target + 2) = (char)(len >> 0x38);
      *(char *)((long)target + 3) = (char)(len >> 0x30);
      *(char *)((long)target + 4) = (char)(len >> 0x28);
      *(char *)((long)target + 5) = (char)(len >> 0x20);
      *(char *)((long)target + 6) = (char)(len >> 0x18);
      *(char *)((long)target + 7) = (char)(len >> 0x10);
      *(undefined1 *)((long)target + 8) = uVar2;
      *(undefined1 *)((long)target + 9) = uVar1;
      memcpy((void *)((long)target + 10),msg,len);
      target_local = (void *)(len + 10);
    }
  }
  return (uint64_t)target_local;
}

Assistant:

static uint64_t websocket_server_wrap(void *target, void *msg, uint64_t len,
                                      unsigned char opcode, unsigned char first,
                                      unsigned char last, unsigned char rsv) {
  ((uint8_t *)target)[0] = 0 |
                           /* opcode */ (((first ? opcode : 0) & 15)) |
                           /* rsv */ ((rsv & 7) << 4) |
                           /*fin*/ ((last & 1) << 7);
  if (len < 126) {
    ((uint8_t *)target)[1] = len;
    memcpy(((uint8_t *)target) + 2, msg, len);
    return len + 2;
  } else if (len < (1UL << 16)) {
    /* head is 4 bytes */
    ((uint8_t *)target)[1] = 126;
    websocket_u2str16(((uint8_t *)target + 2), len);
    memcpy((uint8_t *)target + 4, msg, len);
    return len + 4;
  }
  /* Really Long Message  */
  ((uint8_t *)target)[1] = 127;
  websocket_u2str64(((uint8_t *)target + 2), len);
  memcpy((uint8_t *)target + 10, msg, len);
  return len + 10;
}